

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  BYTE *src;
  int disableLiteralsCompression;
  uint uVar3;
  size_t sVar4;
  size_t err_code_1;
  size_t err_code;
  size_t litSize;
  void *workspace_local;
  ZSTD_entropyCTablesMetadata_t *entropyMetadata_local;
  ZSTD_CCtx_params *cctxParams_local;
  ZSTD_entropyCTables_t *nextEntropy_local;
  ZSTD_entropyCTables_t *prevEntropy_local;
  seqStore_t *seqStorePtr_local;
  
  pBVar1 = seqStorePtr->lit;
  pBVar2 = seqStorePtr->litStart;
  src = seqStorePtr->litStart;
  disableLiteralsCompression = ZSTD_disableLiteralsCompression(cctxParams);
  sVar4 = ZSTD_buildBlockEntropyStats_literals
                    (src,(long)pBVar1 - (long)pBVar2,&prevEntropy->huf,&nextEntropy->huf,
                     &entropyMetadata->hufMetadata,disableLiteralsCompression,workspace,wkspSize);
  (entropyMetadata->hufMetadata).hufDesSize = sVar4;
  seqStorePtr_local = (seqStore_t *)(entropyMetadata->hufMetadata).hufDesSize;
  uVar3 = ERR_isError((size_t)seqStorePtr_local);
  if (uVar3 == 0) {
    sVar4 = ZSTD_buildBlockEntropyStats_sequences
                      (seqStorePtr,&prevEntropy->fse,&nextEntropy->fse,cctxParams,
                       &entropyMetadata->fseMetadata,workspace,wkspSize);
    (entropyMetadata->fseMetadata).fseTablesSize = sVar4;
    seqStorePtr_local = (seqStore_t *)(entropyMetadata->fseMetadata).fseTablesSize;
    uVar3 = ERR_isError((size_t)seqStorePtr_local);
    if (uVar3 == 0) {
      seqStorePtr_local = (seqStore_t *)0x0;
    }
  }
  return (size_t)seqStorePtr_local;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(seqStore_t* seqStorePtr,
                             const ZSTD_entropyCTables_t* prevEntropy,
                                   ZSTD_entropyCTables_t* nextEntropy,
                             const ZSTD_CCtx_params* cctxParams,
                                   ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                                   void* workspace, size_t wkspSize)
{
    size_t const litSize = seqStorePtr->lit - seqStorePtr->litStart;
    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_disableLiteralsCompression(cctxParams),
                                            workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}